

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O3

void __thiscall lsim::ModelWire::merge(ModelWire *this,ModelWire *other)

{
  pointer puVar1;
  ModelWireSegment *pMVar2;
  unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_> *segment;
  pointer puVar3;
  
  puVar1 = (other->m_segments).
           super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (other->m_segments).
                super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pMVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
             .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl;
    add_segment(this,&(pMVar2->m_ends)._M_elems[0]->m_position,
                &(*(ModelWireJunction **)((long)(pMVar2->m_ends)._M_elems + 8))->m_position);
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_long*,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((other->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (other->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>)
             &this->m_pins);
  return;
}

Assistant:

void ModelWire::merge(ModelWire *other) {
    for (const auto &segment : other->m_segments) {
        add_segment(segment->junction(0)->position(), segment->junction(1)->position());
    } 

	std::copy(other->m_pins.begin(), other->m_pins.end(), std::back_inserter(m_pins));
}